

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minimize_constraint.cpp
# Opt level: O2

void __thiscall Clasp::SharedMinimizeData::resetBounds(SharedMinimizeData *this)

{
  uint uVar1;
  uint uVar2;
  pointer pLVar3;
  long lVar4;
  size_type *psVar5;
  SharedMinimizeData *pSVar6;
  size_type *psVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  size_type *psVar11;
  long local_28;
  
  LOCK();
  (this->gCount_).super___atomic_base<unsigned_int>._M_i = 0;
  UNLOCK();
  this->optGen_ = 0;
  local_28 = 0;
  std::__fill_n_a<std::atomic<long>*,unsigned_int,long>
            (this->lower_,(this->adjust_).ebo_.size,&local_28);
  local_28 = 0x7fffffffffffffff;
  bk_lib::pod_vector<long,_std::allocator<long>_>::assign
            (this->up_,(this->adjust_).ebo_.size,&local_28);
  local_28 = 0x7fffffffffffffff;
  bk_lib::pod_vector<long,_std::allocator<long>_>::assign
            (this->up_ + 1,(this->adjust_).ebo_.size,&local_28);
  pSVar6 = this + 1;
  uVar1 = (this->weights).ebo_.size;
  uVar8 = 0;
LAB_0014af99:
  uVar9 = uVar8;
  uVar8 = uVar9;
  if (uVar9 == uVar1) {
    return;
  }
  do {
    pLVar3 = (this->weights).ebo_.buf;
    do {
      uVar10 = (ulong)uVar8;
      uVar8 = uVar8 + 1;
      if (-1 < *(int *)(pLVar3 + uVar10)) goto LAB_0014af99;
    } while (-1 < pLVar3[uVar8].weight);
    psVar7 = &pSVar6[-1].prios.ebo_.size;
    psVar5 = &(pSVar6->adjust_).ebo_.cap;
    do {
      psVar11 = psVar5;
      pSVar6 = (SharedMinimizeData *)(psVar7 + 2);
      lVar4 = (long)(psVar7 + 3);
      psVar7 = (size_type *)pSVar6;
      psVar5 = psVar11 + 2;
      uVar2 = uVar9;
    } while (*(uint *)lVar4 != uVar9);
    while (uVar2 == uVar9) {
      pLVar3 = (this->weights).ebo_.buf;
      LOCK();
      this->lower_[*(uint *)(pLVar3 + uVar8) & 0x7fffffff].super___atomic_base<long>._M_i =
           this->lower_[*(uint *)(pLVar3 + uVar8) & 0x7fffffff].super___atomic_base<long>._M_i +
           (long)pLVar3[uVar8].weight;
      UNLOCK();
      uVar2 = *psVar11;
      psVar11 = psVar11 + 2;
    }
  } while( true );
}

Assistant:

void SharedMinimizeData::resetBounds() {
	gCount_  = 0;
	optGen_  = 0;
	std::fill_n(lower_, numRules(), wsum_t(0));
	up_[0].assign(numRules(), maxBound());
	up_[1].assign(numRules(), maxBound());
	const WeightLiteral* lit = lits;
	for (weight_t wPos = 0, end = (weight_t)weights.size(), x; wPos != end; wPos = x+1) {
		assert(weights[wPos].weight >= 0);
		for (x = wPos; weights[x].next; ) { // compound weight - check for negative
			if (weights[++x].weight < 0) {
				while (lit->second != wPos) { ++lit; }
				for (const WeightLiteral* t = lit; t->second == wPos; ++t) {
					lower_[weights[x].level] += weights[x].weight;
				}
			}
		}
	}
}